

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O0

void __thiscall MPEGStreamReader::fillAspectBySAR(MPEGStreamReader *this,double sar)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  double dVar4;
  VideoAspectRatio local_2c;
  double dStack_28;
  uint i;
  double minEps;
  double ar;
  double sar_local;
  MPEGStreamReader *this_local;
  
  if (this->m_streamAR == AR_KEEP_DEFAULT) {
    uVar1 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
              _vptr_BaseAbstractStreamReader[0x14])();
    uVar2 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
              _vptr_BaseAbstractStreamReader[0x15])();
    dVar4 = ((double)uVar1 * sar) / (double)uVar2;
    dStack_28 = 2147483647.0;
    this->m_streamAR = AR_KEEP_DEFAULT;
    for (local_2c = AR_KEEP_DEFAULT; sVar3 = std::size<double,5ul>(&fillAspectBySAR::base_ar),
        local_2c < sVar3; local_2c = local_2c + AR_VGA) {
      if (ABS(dVar4 - fillAspectBySAR::base_ar[local_2c]) < dStack_28) {
        dStack_28 = ABS(dVar4 - fillAspectBySAR::base_ar[local_2c]);
        this->m_streamAR = local_2c;
      }
    }
  }
  return;
}

Assistant:

void MPEGStreamReader::fillAspectBySAR(const double sar)
{
    if (m_streamAR == VideoAspectRatio::AR_KEEP_DEFAULT)
    {
        const double ar = getStreamWidth() * sar / static_cast<double>(getStreamHeight());
        static constexpr double base_ar[] = {0.0, 1.0, 4.0 / 3.0, 16.0 / 9.0, 221.0 / 100.0};
        double minEps = INT_MAX;
        m_streamAR = VideoAspectRatio::AR_KEEP_DEFAULT;
        for (unsigned i = 0; i < std::size(base_ar); ++i)
        {
            if (fabs(ar - base_ar[i]) < minEps)
            {
                minEps = fabs(ar - base_ar[i]);
                m_streamAR = static_cast<VideoAspectRatio>(i);
            }
        }
    }
}